

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.hpp
# Opt level: O0

bool __thiscall
deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_char[8]>::isPostguardContaminated
          (StateQueryMemoryWriteGuard<unsigned_char[8]> *this)

{
  ulong local_20;
  size_t i;
  StateQueryMemoryWriteGuard<unsigned_char[8]> *this_local;
  
  local_20 = 0;
  while( true ) {
    if (7 < local_20) {
      return false;
    }
    if (this->m_postguard[local_20] != 0xde) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

bool StateQueryMemoryWriteGuard<T>::isPostguardContaminated (void) const
{
	for (size_t i = 0; i < sizeof(T); ++i)
		if (((deUint8*)&m_postguard)[i] != (deUint8)WRITE_GUARD_VALUE)
			return true;
	return false;
}